

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupTrimmed(Gia_Man_t *p,int fTrimCis,int fTrimCos,int fDualOut,int OutValue)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Man_t *pGVar6;
  bool bVar7;
  int local_44;
  int Entry;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  Vec_Int_t *vNonZero;
  int OutValue_local;
  int fDualOut_local;
  int fTrimCos_local;
  int fTrimCis_local;
  Gia_Man_t *p_local;
  
  pNew = (Gia_Man_t *)0x0;
  vNonZero._0_4_ = OutValue;
  vNonZero._4_4_ = fDualOut;
  OutValue_local = fTrimCos;
  fDualOut_local = fTrimCis;
  _fTrimCos_local = p;
  if ((fDualOut != 0) && (fTrimCos != 0)) {
    pNew = (Gia_Man_t *)Gia_ManDupTrimmedNonZero(p);
  }
  iVar1 = Gia_ManObjNum(_fTrimCos_local);
  pTemp = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav(_fTrimCos_local->pName);
  pTemp->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(_fTrimCos_local->pSpec);
  pTemp->pSpec = pcVar4;
  Gia_ManCreateRefs(_fTrimCos_local);
  local_44 = 0;
  while( true ) {
    iVar1 = Gia_ManPiNum(_fTrimCos_local);
    bVar7 = false;
    if (local_44 < iVar1) {
      _Entry = Gia_ManCi(_fTrimCos_local,local_44);
      bVar7 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (((!bVar7) || (fDualOut_local == 0)) ||
       (iVar1 = Gia_ObjRefNum(_fTrimCos_local,_Entry), iVar1 != 0)) break;
    local_44 = local_44 + 1;
  }
  iVar1 = Gia_ManPiNum(_fTrimCos_local);
  if (local_44 == iVar1) {
    Gia_ManAppendCi(pTemp);
  }
  Gia_ManFillValue(_fTrimCos_local);
  pGVar5 = Gia_ManConst0(_fTrimCos_local);
  pGVar5->Value = 0;
  local_44 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(_fTrimCos_local->vCis);
    bVar7 = false;
    if (local_44 < iVar1) {
      _Entry = Gia_ManCi(_fTrimCos_local,local_44);
      bVar7 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    if (((fDualOut_local == 0) || (iVar1 = Gia_ObjRefNum(_fTrimCos_local,_Entry), iVar1 != 0)) ||
       (iVar1 = Gia_ObjIsRo(_fTrimCos_local,_Entry), iVar1 != 0)) {
      uVar2 = Gia_ManAppendCi(pTemp);
      _Entry->Value = uVar2;
    }
    local_44 = local_44 + 1;
  }
  local_44 = 0;
  while( true ) {
    bVar7 = false;
    if (local_44 < _fTrimCos_local->nObjs) {
      _Entry = Gia_ManObj(_fTrimCos_local,local_44);
      bVar7 = _Entry != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(_Entry);
    if (iVar1 != 0) {
      iVar1 = Gia_ObjFanin0Copy(_Entry);
      iVar3 = Gia_ObjFanin1Copy(_Entry);
      uVar2 = Gia_ManAppendAnd(pTemp,iVar1,iVar3);
      _Entry->Value = uVar2;
    }
    local_44 = local_44 + 1;
  }
  if ((vNonZero._4_4_ == 0) || (OutValue_local == 0)) {
    local_44 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(_fTrimCos_local);
      bVar7 = false;
      if (local_44 < iVar1) {
        _Entry = Gia_ManCo(_fTrimCos_local,local_44);
        bVar7 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (((!bVar7) || (OutValue_local == 0)) ||
         (iVar1 = Gia_ManPoIsToRemove(_fTrimCos_local,_Entry,(int)vNonZero), iVar1 == 0)) break;
      local_44 = local_44 + 1;
    }
    iVar1 = Gia_ManPoNum(_fTrimCos_local);
    if (local_44 == iVar1) {
      Gia_ManAppendCo(pTemp,0);
    }
    local_44 = 0;
    while( true ) {
      iVar1 = Vec_IntSize(_fTrimCos_local->vCos);
      bVar7 = false;
      if (local_44 < iVar1) {
        _Entry = Gia_ManCo(_fTrimCos_local,local_44);
        bVar7 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if (((OutValue_local == 0) ||
          (iVar1 = Gia_ManPoIsToRemove(_fTrimCos_local,_Entry,(int)vNonZero), iVar1 == 0)) ||
         (iVar1 = Gia_ObjIsRi(_fTrimCos_local,_Entry), iVar1 != 0)) {
        iVar1 = Gia_ObjFanin0Copy(_Entry);
        Gia_ManAppendCo(pTemp,iVar1);
      }
      local_44 = local_44 + 1;
    }
    iVar1 = Gia_ManRegNum(_fTrimCos_local);
    Gia_ManSetRegNum(pTemp,iVar1);
  }
  else {
    for (local_44 = 0; iVar1 = Vec_IntSize((Vec_Int_t *)pNew), local_44 < iVar1;
        local_44 = local_44 + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)pNew,local_44);
      pGVar5 = Gia_ManPo(_fTrimCos_local,iVar1 << 1);
      iVar3 = Gia_ObjFanin0Copy(pGVar5);
      Gia_ManAppendCo(pTemp,iVar3);
      pGVar5 = Gia_ManPo(_fTrimCos_local,iVar1 * 2 + 1);
      iVar1 = Gia_ObjFanin0Copy(pGVar5);
      Gia_ManAppendCo(pTemp,iVar1);
    }
    iVar1 = Gia_ManPoNum(pTemp);
    if (iVar1 == 0) {
      Gia_ManAppendCo(pTemp,0);
      Gia_ManAppendCo(pTemp,0);
    }
    local_44 = 0;
    while( true ) {
      iVar1 = Gia_ManRegNum(_fTrimCos_local);
      pGVar6 = _fTrimCos_local;
      bVar7 = false;
      if (local_44 < iVar1) {
        iVar1 = Gia_ManPoNum(_fTrimCos_local);
        _Entry = Gia_ManCo(pGVar6,iVar1 + local_44);
        bVar7 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjFanin0Copy(_Entry);
      Gia_ManAppendCo(pTemp,iVar1);
      local_44 = local_44 + 1;
    }
    iVar1 = Gia_ManRegNum(_fTrimCos_local);
    Gia_ManSetRegNum(pTemp,iVar1);
    pGVar6 = Gia_ManSeqStructSweep(pTemp,1,1,0);
    Gia_ManStop(pTemp);
    pTemp = pGVar6;
  }
  Vec_IntFreeP((Vec_Int_t **)&pNew);
  iVar1 = Gia_ManHasDangling(pTemp);
  if (iVar1 == 0) {
    return pTemp;
  }
  __assert_fail("!Gia_ManHasDangling( pNew )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x8c2,"Gia_Man_t *Gia_ManDupTrimmed(Gia_Man_t *, int, int, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupTrimmed( Gia_Man_t * p, int fTrimCis, int fTrimCos, int fDualOut, int OutValue )
{
    Vec_Int_t * vNonZero = NULL;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i, Entry;
    // collect non-zero
    if ( fDualOut && fTrimCos )
        vNonZero = Gia_ManDupTrimmedNonZero( p );
    // start new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // check if there are PIs to be added
    Gia_ManCreateRefs( p );
    Gia_ManForEachPi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) )
            break;
    if ( i == Gia_ManPiNum(p) ) // there is no PIs - add dummy PI
        Gia_ManAppendCi(pNew);
    // add the ROs
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( !fTrimCis || Gia_ObjRefNum(p, pObj) || Gia_ObjIsRo(p, pObj) )
            pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    if ( fDualOut && fTrimCos )
    {
        Vec_IntForEachEntry( vNonZero, Entry, i )
        {
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+0)) );
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 2*Entry+1)) );
        }
        if ( Gia_ManPoNum(pNew) == 0 ) // nothing - add dummy PO
        {
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 0)) );
//            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(Gia_ManPo(p, 1)) );
            Gia_ManAppendCo( pNew, 0 );
            Gia_ManAppendCo( pNew, 0 );
        }
        Gia_ManForEachRi( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
        // cleanup
        pNew = Gia_ManSeqStructSweep( pTemp = pNew, 1, 1, 0 );
        Gia_ManStop( pTemp );
        // trim the PIs
//        pNew = Gia_ManDupTrimmed( pTemp = pNew, 1, 0, 0 );
//        Gia_ManStop( pTemp );
    }
    else
    {
        // check if there are POs to be added
        Gia_ManForEachPo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) )
                break;
        if ( i == Gia_ManPoNum(p) ) // there is no POs - add dummy PO
            Gia_ManAppendCo( pNew, 0 );
        Gia_ManForEachCo( p, pObj, i )
            if ( !fTrimCos || !Gia_ManPoIsToRemove(p, pObj, OutValue) || Gia_ObjIsRi(p, pObj) )
                Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    }
    Vec_IntFreeP( &vNonZero );
    assert( !Gia_ManHasDangling( pNew ) );
    return pNew;
}